

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recog_intel.c
# Opt level: O3

int cpuid_identify_intel(cpu_raw_data_t *raw,cpu_id_t *data,internal_id_info_t *internal)

{
  char *__s;
  char cVar1;
  undefined1 uVar2;
  ushort *puVar3;
  cpu_purpose_t cVar4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  char *pcVar8;
  ulong uVar9;
  ushort **ppuVar10;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  amd_code_t aVar15;
  uint uVar16;
  amd_code_t brand_code;
  ulong bits;
  int iVar17;
  feature_map_t *pfVar18;
  feature_map_t *pfVar19;
  ulong uVar20;
  cpu_epc_t cVar21;
  feature_map_t matchtable_edx81 [1];
  feature_map_t matchtable_ecx1 [10];
  feature_map_t matchtable_ebx7 [5];
  feature_map_t matchtable_edx1 [7];
  uint local_1bc;
  feature_map_t local_1a0;
  feature_map_t local_198;
  uint8_t local_190;
  uint8_t local_18e;
  uint8_t local_18c;
  uint8_t local_176;
  uint8_t local_175;
  uint8_t local_173;
  uint8_t local_16f;
  uint8_t local_16c;
  uint8_t local_168;
  uint8_t local_15f;
  uint8_t local_15e;
  uint8_t local_15d;
  uint8_t local_15c;
  uint8_t local_15b;
  uint8_t local_15a;
  char local_158;
  uint8_t local_157;
  uint8_t local_156;
  uint8_t local_155;
  uint8_t local_154;
  uint8_t local_153;
  uint8_t local_152;
  uint8_t local_151;
  char local_14f;
  uint8_t local_14e;
  uint8_t local_14d;
  uint8_t local_14c;
  uint8_t local_14b;
  uint8_t local_14a;
  uint8_t local_138;
  uint8_t local_132;
  uint8_t local_131;
  uint8_t local_130;
  uint8_t local_128;
  uint8_t local_127;
  uint8_t local_126;
  uint8_t local_125;
  uint8_t local_120;
  uint8_t local_11f;
  uint8_t local_11e;
  uint8_t local_11d;
  uint8_t local_11c;
  uint8_t local_11b;
  uint8_t local_119;
  uint8_t local_116;
  uint8_t local_115;
  uint8_t local_114;
  uint8_t local_113;
  uint8_t local_112;
  uint8_t local_111;
  feature_map_t local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  feature_map_t local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_48 = 0x1b0000001d;
  uStack_40 = 0x1c0000001e;
  local_58 = 0x1400000016;
  uStack_50 = 0x190000001b;
  local_68.bit = 0x12;
  local_68.feature = CPU_FEATURE_PN;
  uStack_60 = 0x1300000015;
  local_38 = 0x1d0000001f;
  pfVar18 = (feature_map_t *)&DAT_0012d2d0;
  pfVar19 = &local_198;
  for (lVar14 = 10; lVar14 != 0; lVar14 = lVar14 + -1) {
    *pfVar19 = *pfVar18;
    pfVar18 = pfVar18 + 1;
    pfVar19 = pfVar19 + 1;
  }
  local_1a0.bit = 0x14;
  local_1a0.feature = CPU_FEATURE_XD;
  local_88 = 0x620000000b;
  uStack_80 = 0x650000001a;
  local_98.bit = 2;
  local_98.feature = CPU_FEATURE_SGX;
  uStack_90 = 0x6100000004;
  local_78 = 0x660000001b;
  if (raw->basic_cpuid[0][0] != 0) {
    match_features(&local_68,7,raw->basic_cpuid[1][3],data);
    match_features(&local_198,10,raw->basic_cpuid[1][2],data);
  }
  if (raw->ext_cpuid[0][0] != 0) {
    match_features(&local_1a0,1,raw->ext_cpuid[1][3],data);
  }
  uVar16 = raw->basic_cpuid[0][0];
  if (6 < uVar16) {
    match_features(&local_98,5,raw->basic_cpuid[7][1],data);
    uVar16 = raw->basic_cpuid[0][0];
  }
  if (uVar16 < 4) {
    if (1 < uVar16) {
      lVar14 = 0;
      memset(&local_198,0,0x100);
      do {
        uVar16 = raw->basic_cpuid[2][lVar14];
        if (-1 < (int)uVar16) {
          iVar5 = 4;
          do {
            *(undefined1 *)((long)&local_198.bit + (ulong)(uVar16 & 0xff)) = 1;
            uVar16 = uVar16 >> 8;
            iVar5 = iVar5 + -1;
          } while (iVar5 != 0);
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != 4);
      assign_cache_data(local_198.feature._2_1_,L1I,8,4,0x20,data);
      assign_cache_data(local_190,L1I,0x10,4,0x20,data);
      assign_cache_data(local_18e,L1D,8,2,0x20,data);
      assign_cache_data(local_18c,L1D,0x10,4,0x20,data);
      assign_cache_data(local_176,L3,0x200,4,0x40,data);
      assign_cache_data(local_175,L3,0x400,8,0x40,data);
      assign_cache_data(local_173,L3,0x800,8,0x40,data);
      assign_cache_data(local_16f,L3,0x1000,8,0x40,data);
      assign_cache_data(local_16c,L1D,0x20,8,0x40,data);
      assign_cache_data(local_168,L1I,0x20,8,0x40,data);
      assign_cache_data(local_15f,L2,0x80,4,0x40,data);
      assign_cache_data(local_15e,L2,0xc0,6,0x40,data);
      assign_cache_data(local_15d,L2,0x80,2,0x40,data);
      assign_cache_data(local_15c,L2,0x100,4,0x40,data);
      assign_cache_data(local_15b,L2,0x180,6,0x40,data);
      assign_cache_data(local_15a,L2,0x200,4,0x40,data);
      assign_cache_data(local_157,L2,0x80,4,0x20,data);
      assign_cache_data(local_156,L2,0x100,4,0x20,data);
      assign_cache_data(local_155,L2,0x200,4,0x20,data);
      assign_cache_data(local_154,L2,0x400,4,0x20,data);
      assign_cache_data(local_153,L2,0x800,4,0x20,data);
      assign_cache_data(local_152,L3,0x1000,4,0x40,data);
      assign_cache_data(local_151,L3,0x2000,8,0x40,data);
      assign_cache_data(local_14e,L3,0x1800,0xc,0x40,data);
      assign_cache_data(local_14d,L3,0x2000,0x10,0x40,data);
      assign_cache_data(local_14c,L3,0x3000,0xc,0x40,data);
      assign_cache_data(local_14b,L3,0x4000,0x10,0x40,data);
      assign_cache_data(local_14a,L2,0x1800,0x18,0x40,data);
      assign_cache_data(local_138,L1D,0x10,8,0x40,data);
      assign_cache_data(local_132,L1D,8,4,0x40,data);
      assign_cache_data(local_131,L1D,0x10,4,0x40,data);
      assign_cache_data(local_130,L1D,0x20,4,0x40,data);
      assign_cache_data(local_128,L1I,0xc,8,-1,data);
      assign_cache_data(local_127,L1I,0x10,8,-1,data);
      assign_cache_data(local_126,L1I,0x20,8,-1,data);
      assign_cache_data(local_125,L1I,0x40,8,-1,data);
      assign_cache_data(local_120,L2,0x400,4,0x40,data);
      assign_cache_data(local_11f,L2,0x80,8,0x40,data);
      assign_cache_data(local_11e,L2,0x100,8,0x40,data);
      assign_cache_data(local_11d,L2,0x200,8,0x40,data);
      assign_cache_data(local_11c,L2,0x400,8,0x40,data);
      assign_cache_data(local_11b,L2,0x800,8,0x40,data);
      assign_cache_data(local_119,L2,0x200,2,0x40,data);
      assign_cache_data(local_116,L2,0x100,8,0x20,data);
      assign_cache_data(local_115,L2,0x200,8,0x20,data);
      assign_cache_data(local_114,L2,0x400,8,0x20,data);
      assign_cache_data(local_113,L2,0x800,8,0x20,data);
      assign_cache_data(local_112,L2,0x200,4,0x40,data);
      assign_cache_data(local_111,L2,0x400,8,0x40,data);
      if (local_14f != '\0') {
        if (((data->field_11).x86.family == 0xf) && ((data->field_11).x86.model == 6)) {
          data->l3_cache = 0x1000;
          data->l3_assoc = 0x10;
          data->l3_cacheline = 0x40;
        }
        else {
          data->l2_cache = 0x1000;
          data->l2_assoc = 0x10;
          data->l2_cacheline = 0x40;
        }
      }
      if (local_158 != '\0') {
        if (data->l2_cache == -1) {
          data->l2_cache = 0;
        }
        else {
          data->l3_cache = 0;
        }
      }
    }
  }
  else {
    decode_deterministic_cache_info_x86(raw->intel_fn4,'\b',data,internal);
  }
  if (raw->basic_cpuid[0][0] < 0xb) {
LAB_0011124c:
    decode_number_of_cores_x86(raw,data);
  }
  else {
    uVar16 = 0xffffffff;
    lVar14 = 0;
    uVar12 = 0xffffffff;
    do {
      if ((*(int *)((long)raw->intel_fn11[0] + lVar14) == 0) ||
         (uVar13 = *(uint *)((long)raw->intel_fn11[0] + lVar14 + 4), uVar13 == 0)) break;
      cVar1 = *(char *)((long)raw->intel_fn11[0] + lVar14 + 9);
      if (cVar1 == '\x02') {
        uVar16 = uVar13 & 0xffff;
      }
      else if (cVar1 == '\x01') {
        uVar12 = uVar13 & 0xffff;
      }
      lVar14 = lVar14 + 0x10;
    } while (lVar14 != 0x40);
    if (uVar16 == 0xffffffff || uVar12 == 0xffffffff) goto LAB_0011124c;
    data->num_logical_cpus = uVar16;
    uVar13 = 1;
    if (1 < (int)(uVar16 / uVar12)) {
      uVar13 = uVar16 / uVar12;
    }
    data->num_cores = uVar13;
  }
  cVar4 = cpuid_identify_purpose_intel(raw);
  data->purpose = cVar4;
  decode_architecture_version_x86(data);
  __s = data->brand_str;
  sVar6 = strlen(__s);
  lVar14 = 8;
  bits = 0;
  do {
    iVar5 = match_pattern(__s,*(char **)((long)&DAT_00134cd0 + lVar14));
    if (iVar5 != 0) {
      bits = bits | *(ulong *)(&UNK_00134cc8 + lVar14);
    }
    lVar14 = lVar14 + 0x10;
  } while (lVar14 != 0xb8);
  iVar5 = match_pattern(__s,"Core(TM) [im][3579]");
  if (iVar5 == 0) {
    iVar5 = match_pattern(__s,"Core(TM) [3579]");
    if (iVar5 != 0) {
      uVar9 = bits | 0x10000;
      switch(data->brand_str[(long)iVar5 + 8]) {
      case '3':
        uVar9 = bits | 0x10008;
        break;
      case '5':
        uVar9 = bits | 0x10010;
        break;
      case '7':
        uVar9 = bits | 0x10020;
        break;
      case '9':
        uVar9 = bits | 0x10040;
      }
      bits = uVar9;
      sVar7 = (size_t)(iVar5 + 9);
      if (sVar7 < sVar6) {
        do {
          cVar1 = __s[sVar7];
          switch(cVar1) {
          case 'E':
            bits = bits | 0x2000;
            break;
          case 'F':
            bits = bits | 0x800;
            break;
          case 'G':
          case 'I':
          case 'J':
          case 'K':
            break;
          case 'H':
            bits = bits | 0x80;
            break;
          case 'L':
            bits = bits | 0x400000000;
            break;
          default:
            if (cVar1 == 'T') {
              bits = bits | 0x800000000;
            }
            else if (cVar1 == 'U') {
              bits = bits | 0x200;
            }
          }
          sVar7 = sVar7 + 1;
        } while (sVar6 != sVar7);
      }
      goto switchD_001114ad_caseD_34;
    }
    iVar5 = match_pattern(__s,"Core(TM) Ultra [3579]");
    if (iVar5 == 0) {
      iVar5 = match_pattern(__s,"Xeon(R) w[3579]");
      if (iVar5 == 0) {
        iVar5 = match_pattern(__s,"Xeon(R) [DW]");
        if (iVar5 == 0) {
          iVar5 = match_pattern(__s,"[NU]##");
          if (iVar5 != 0) {
            if (data->vendor_str[(long)iVar5 + 0xf] == 'U') {
              bits = bits | 0x1000000000;
            }
            else if (data->vendor_str[(long)iVar5 + 0xf] == 'N') {
              bits = bits | 0x80000000;
            }
          }
        }
        else if (data->brand_str[(long)iVar5 + 7] == 'W') {
          bits = bits | 0x840000;
        }
        else if (data->brand_str[(long)iVar5 + 7] == 'D') {
          bits = bits | 0x1040000;
        }
        else {
          bits = bits | 0x40000;
        }
      }
      else {
        uVar9 = (ulong)(data->brand_str[(long)iVar5 + 7] == 'w') << 0x17 | bits;
        bits = uVar9 | 0x40000;
        switch(data->brand_str[(long)iVar5 + 8]) {
        case '3':
          bits = uVar9 | 0x40008;
          break;
        case '5':
          bits = uVar9 | 0x40010;
          break;
        case '7':
          bits = uVar9 | 0x40020;
          break;
        case '9':
          bits = uVar9 | 0x40040;
        }
      }
      goto switchD_001114ad_caseD_34;
    }
    uVar9 = bits | 0x100010000;
    switch(data->brand_str[(long)iVar5 + 0xe]) {
    case '3':
      uVar9 = 0x100010008;
      break;
    default:
      goto switchD_001113c8_caseD_34;
    case '5':
      uVar9 = 0x100010010;
      break;
    case '7':
      uVar9 = 0x100010020;
      break;
    case '9':
      uVar9 = 0x100010040;
    }
    uVar9 = bits | uVar9;
switchD_001113c8_caseD_34:
    bits = uVar9;
    sVar7 = (size_t)(iVar5 + 0xf);
    if (sVar7 < sVar6) {
      do {
        switch(__s[sVar7]) {
        case 'F':
          bits = bits | 0x800;
          break;
        case 'H':
          bits = bits | 0x80;
          break;
        case 'K':
          bits = bits | 0x100000;
          break;
        case 'L':
          bits = bits | 0x400000000;
          break;
        case 'T':
          bits = bits | 0x800000000;
          break;
        case 'U':
          bits = bits | 0x200;
          break;
        case 'V':
          bits = bits | 0x200000000;
          break;
        case 'X':
          bits = bits | 0x400;
        }
        sVar7 = sVar7 + 1;
      } while (sVar6 != sVar7);
    }
  }
  else {
    if (data->brand_str[(long)iVar5 + 8] == 'm') {
      bits = bits | 0x10001;
    }
    else if (data->brand_str[(long)iVar5 + 8] == 'i') {
      bits = bits | 0x30000;
    }
    else {
      bits = bits | 0x10000;
    }
    switch(data->brand_str[(long)iVar5 + 9]) {
    case '3':
      bits = bits | 8;
      break;
    case '5':
      bits = bits | 0x10;
      break;
    case '7':
      bits = bits | 0x20;
      break;
    case '9':
      bits = bits | 0x40;
    }
    sVar7 = (size_t)(iVar5 + 10);
    if (sVar7 < sVar6) {
      do {
        switch(__s[sVar7]) {
        case 'H':
          bits = bits | 0x80;
          break;
        case 'K':
          bits = bits | 0x100000;
          break;
        case 'N':
          bits = bits | 0x400000;
          break;
        case 'P':
          bits = bits | 0x200000;
          break;
        case 'S':
          bits = bits | 0x100;
          break;
        case 'U':
          bits = bits | 0x200;
          break;
        case 'X':
          bits = bits | 0x400;
        }
        sVar7 = sVar7 + 1;
      } while (sVar6 != sVar7);
    }
  }
switchD_001114ad_caseD_34:
  if (((bits & 0xc000) != 0) && (iVar5 = match_pattern(__s,"[JN]"), iVar5 != 0)) {
    if (data->vendor_str[(long)iVar5 + 0xf] == 'N') {
      bits = bits | 0x80000000;
    }
    else if (data->vendor_str[(long)iVar5 + 0xf] == 'J') {
      bits = bits | 0x40000000;
    }
  }
  lVar14 = 8;
  do {
    iVar5 = match_pattern(__s,*(char **)((long)&DAT_00134c30 + lVar14));
    if (iVar5 != 0) {
      aVar15 = *(amd_code_t *)((long)&intel_bcode_str[0x16].str + lVar14);
      goto LAB_001116fb;
    }
    lVar14 = lVar14 + 0x10;
  } while (lVar14 != 0xa8);
  aVar15 = 1;
LAB_001116fb:
  debugf(2,"intel matchtable result is %d\n",(ulong)aVar15);
  if (((uint)bits >> 0x12 & 1) != 0) {
    iVar5 = match_pattern(__s,"W35##");
    if ((iVar5 == 0) && (iVar5 = match_pattern(__s,"[ELXW]75##"), iVar5 == 0)) {
      iVar5 = match_pattern(__s,"[ELXW]55##");
      if (iVar5 == 0) {
        iVar5 = match_pattern(__s,"[ELXW]56##");
        if (iVar5 == 0) {
          if ((0 < data->l3_cache) && ((data->field_11).x86.family == 0x10)) {
            aVar15 = 0x7d1;
          }
        }
        else {
          aVar15 = 0x7d4;
        }
      }
      else {
        aVar15 = 0x7d3;
      }
    }
    else {
      bits = bits | 0x20;
    }
  }
  iVar5 = match_all(bits,0x40004);
  if ((iVar5 == 0) || (brand_code = 0x7d2, data->l3_cache < 1)) {
    if (aVar15 == 0x7d9) {
LAB_001117b0:
      brand_code = 0x7d9;
      if (((bits & 2) != 0) && ((data->field_11).x86.model != 0xe)) {
        brand_code = (data->field_11).x86.ext_model < 0x17 ^ 0x7dd;
      }
    }
    else {
      brand_code = aVar15;
      if (aVar15 == 0x7d7) {
        pcVar8 = strstr(__s,"CPU");
        if (pcVar8 != (char *)0x0) {
          for (pcVar8 = pcVar8 + 3; *pcVar8 == ' '; pcVar8 = pcVar8 + 1) {
          }
          if (*pcVar8 == 'T') {
            bits = bits | 2;
          }
        }
        iVar5 = data->num_cores;
        if (iVar5 == 1) {
          brand_code = 0x7d7;
        }
        else if (iVar5 == 4) {
          brand_code = (uint)(4 < data->num_logical_cpus) * 2 + 0x7de;
        }
        else if (iVar5 == 2) {
          brand_code = 0x7df;
          if (data->num_logical_cpus < 3) goto LAB_001117b0;
        }
        else {
          brand_code = 0x7e1;
        }
      }
    }
  }
  if (((data->field_11).x86.ext_model == 0x17) &&
     (((brand_code == 0x7d9 || (brand_code == 0x7e2)) || ((short)bits < 0)))) {
    brand_code = 0x7db;
  }
  sVar6 = strlen(__s);
  iVar5 = match_pattern(__s,"Core(TM) i[3579]");
  iVar17 = (int)sVar6;
  if (iVar5 != 0) {
    local_1bc = 0xffffffff;
    if (iVar5 + 0xe < iVar17) {
      bVar11 = data->brand_str[(long)iVar5 + 0xb];
      if ((byte)(bVar11 - 0x32) < 8) {
        local_1bc = bVar11 + 0x3c;
      }
      else if (((iVar5 + 0xf < iVar17) && (bVar11 == 0x31)) &&
              ((byte)(data->brand_str[(long)iVar5 + 0xc] - 0x30U) < 5)) {
        local_1bc = (byte)data->brand_str[(long)iVar5 + 0xc] + 0x46;
      }
    }
    goto switchD_00111e3b_default;
  }
  iVar5 = match_pattern(__s,"Core(TM) [3579]");
  if (iVar5 == 0) {
    iVar5 = match_pattern(__s,"Core(TM) Ultra [3579]");
    if (iVar5 != 0) {
      local_1bc = 0xffffffff;
      if (iVar5 + 0x12 < iVar17) {
        local_1bc = 0x80;
        if (data->brand_str[(long)iVar5 + 0x10] != '1') {
          local_1bc = -(uint)(data->brand_str[(long)iVar5 + 0x10] != '2') | 0x81;
        }
      }
      goto switchD_00111e3b_default;
    }
    iVar5 = match_pattern(__s,"Xeon(R) [WBSGP]");
    if (iVar5 == 0) {
      local_1bc = 0xffffffff;
      if (3 < iVar17) {
        uVar9 = 0;
        do {
          if (((data->brand_str[uVar9] == 'C') && (data->brand_str[uVar9 + 1] == 'P')) &&
             (data->brand_str[uVar9 + 2] == 'U')) {
            iVar5 = iVar17 + -4;
            if ((int)uVar9 + 3 < iVar5) {
              goto LAB_00111cff;
            }
            break;
          }
          uVar9 = uVar9 + 1;
        } while (iVar17 - 3 != uVar9);
      }
      goto switchD_00111e3b_default;
    }
    iVar5 = match_pattern(__s,"Xeon(R) W-");
    if (iVar5 == 0) {
      iVar5 = match_pattern(__s,"Xeon(R) Bronze");
      if ((iVar5 == 0) && (iVar5 = match_pattern(__s,"Xeon(R) Silver"), iVar5 == 0)) {
        iVar5 = match_pattern(__s,"Xeon(R) Gold");
        if (iVar5 == 0) {
          iVar5 = match_pattern(__s,"Xeon(R) Platinum");
          if (iVar5 == 0) {
            iVar5 = match_pattern(__s,"Xeon(R) Max");
            if (iVar5 == 0) goto LAB_001118ad;
            iVar5 = iVar5 + 0xc;
          }
          else {
            iVar5 = iVar5 + 0x11;
          }
        }
        else {
          iVar5 = iVar5 + 0xd;
        }
      }
      else {
        iVar5 = iVar5 + 0xf;
      }
    }
    else {
      iVar5 = iVar5 + 10;
    }
    local_1bc = 0xffffffff;
    if ((iVar5 != 0) && ((byte)(__s[iVar5] - 0x31U) < 5)) {
      local_1bc = (byte)__s[iVar5] + 0x4a;
    }
  }
  else {
    local_1bc = 0xffffffff;
    if (iVar17 <= iVar5 + 0xd) goto switchD_00111e3b_default;
    cVar1 = data->brand_str[(long)iVar5 + 0xb];
    if ((((cVar1 == '3') || (cVar1 == '2')) || (cVar1 == '1')) &&
       (local_1bc = 0x82, data->brand_str[(long)iVar5 + 0xc] == '5')) goto switchD_00111e3b_default;
LAB_001118ad:
    local_1bc = 0xffffffff;
  }
  goto switchD_00111e3b_default;
  while (uVar9 = uVar9 + 1, iVar17 + -7 != (int)uVar9) {
LAB_00111cff:
    if (data->brand_str[uVar9 + 3] != ' ') {
      uVar20 = uVar9 + 3;
      if ((int)uVar20 < iVar5) {
        pcVar8 = data->brand_str + uVar9 + 4;
        ppuVar10 = __ctype_b_loc();
        puVar3 = *ppuVar10;
        uVar16 = 0;
        goto LAB_00111d72;
      }
      break;
    }
  }
  goto switchD_00111e3b_default;
  while( true ) {
    bVar11 = pcVar8[-1] + 0xbf;
    uVar12 = 1 << (bVar11 & 0x1f);
    if (0x19 < bVar11) {
      uVar12 = 0;
    }
    uVar16 = uVar16 | uVar12;
    uVar20 = uVar20 + 1;
    pcVar8 = pcVar8 + 1;
    if (iVar5 <= (int)uVar20) break;
LAB_00111d72:
    if ((*(byte *)((long)puVar3 + (long)pcVar8[-1] * 2 + 1) & 8) != 0) {
      lVar14 = (long)__s[uVar20 & 0xffffffff];
      if ((*(byte *)((long)puVar3 + lVar14 * 2 + 1) & 8) != 0) {
        iVar5 = 0;
        iVar17 = 4;
        do {
          iVar5 = (int)(char)lVar14 + iVar5 * 10 + -0x30;
          lVar14 = (long)*pcVar8;
          pcVar8 = pcVar8 + 1;
          iVar17 = iVar17 + -1;
        } while ((*(byte *)((long)puVar3 + lVar14 * 2 + 1) & 8) != 0);
        if (iVar17 == 0) {
          iVar17 = iVar5 >> 0x1f;
          iVar5 = iVar5 / 100 + iVar17;
          switch(iVar5 - iVar17) {
          case 0x1e:
            local_1bc = 100;
            break;
          case 0x1f:
            local_1bc = 0x65;
            break;
          case 0x20:
            local_1bc = ((uVar16 >> 0x17 & 1) != 0) + 0x66;
            break;
          case 0x21:
            local_1bc = ((uVar16 >> 0x17 & 1) != 0) + 0x68;
            break;
          default:
            switch(iVar5 - iVar17) {
            case 0x33:
              local_1bc = 0x6a;
              break;
            case 0x34:
              local_1bc = 0x6b;
              break;
            case 0x35:
              local_1bc = 0x6c;
              break;
            case 0x36:
              local_1bc = 0x6d;
            }
          }
        }
      }
      break;
    }
  }
switchD_00111e3b_default:
  lVar14 = 8;
  do {
    if (brand_code == *(amd_code_t *)(&UNK_00134ab8 + lVar14)) {
      if (*(long *)((long)&intel_bcode_str[0].code + lVar14) != 0) {
        debugf(2,"Detected Intel brand code: %d (%s)\n",(ulong)brand_code);
        goto LAB_00111ac4;
      }
      break;
    }
    lVar14 = lVar14 + 0x10;
  } while (lVar14 != 0x178);
  debugf(2,"Detected Intel brand code: %d\n",(ulong)brand_code);
LAB_00111ac4:
  if (bits != 0) {
    debugf(2,"Detected Intel bits: ");
    debug_print_lbits(2,bits);
  }
  debugf(2,"Detected Intel model code: %d\n",(ulong)local_1bc);
  (internal->code).amd = brand_code;
  internal->bits = bits;
  if (((data->flags[0x6b] != '\0') &&
      (debugf(2,"SGX seems to be present, decoding...\n"), 0x11 < raw->basic_cpuid[0][0])) &&
     (uVar16 = raw->basic_cpuid[0x12][0], uVar16 != 0)) {
    if ((uVar16 & 1) != 0) {
      *(undefined1 *)((long)&data->field_11 + 0x1e) = 1;
      uVar16 = raw->basic_cpuid[0x12][0];
    }
    if ((uVar16 & 2) != 0) {
      *(undefined1 *)((long)&data->field_11 + 0x1f) = 1;
    }
    if ((*(char *)((long)&data->field_11 + 0x1e) != '\0') ||
       (*(char *)((long)&data->field_11 + 0x1f) != '\0')) {
      (data->field_11).x86.sgx.present = 1;
    }
    (data->field_11).x86.sgx.misc_select = raw->basic_cpuid[0x12][1];
    uVar2 = *(undefined1 *)((long)raw->basic_cpuid[0x12] + 0xd);
    *(char *)((long)&data->field_11 + 0x1c) = (char)raw->basic_cpuid[0x12][3];
    *(undefined1 *)((long)&data->field_11 + 0x1d) = uVar2;
    *(undefined8 *)((long)&data->field_11 + 0x38) = *(undefined8 *)raw->intel_fn12h[1];
    *(undefined8 *)((long)&data->field_11 + 0x40) = *(undefined8 *)(raw->intel_fn12h[1] + 2);
    (data->field_11).x86.sgx.num_epc_sections = -1;
    uVar16 = 0;
    do {
      cVar21 = cpuid_get_epc(uVar16,raw);
      if (cVar21.length == 0) {
        debugf(2,"SGX: epc section request for %d returned null, no more EPC sections.\n",
               (ulong)uVar16);
        goto LAB_00111c1d;
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != 1000000);
    if ((data->field_11).x86.sgx.num_epc_sections == -1) {
      debugf(1,"SGX: warning: seems to be infinitude of EPC sections.\n");
      uVar16 = 1000000;
LAB_00111c1d:
      (data->field_11).x86.sgx.num_epc_sections = uVar16;
    }
  }
  iVar5 = match_cpu_codename(cpudb_intel,0x1a2,data,brand_code,bits,local_1bc);
  internal->score = iVar5;
  return 0;
}

Assistant:

int cpuid_identify_intel(struct cpu_raw_data_t* raw, struct cpu_id_t* data, struct internal_id_info_t* internal)
{
	intel_code_and_bits_t brand;
	intel_model_t model_code;
	int i;
	char* brand_code_str = NULL;

	load_intel_features(raw, data);
	if (raw->basic_cpuid[0][EAX] >= 4) {
		/* Deterministic way is preferred, being more generic */
		decode_deterministic_cache_info_x86(raw->intel_fn4, MAX_INTELFN4_LEVEL, data, internal);
	} else if (raw->basic_cpuid[0][EAX] >= 2) {
		decode_intel_oldstyle_cache_info(raw, data);
	}
	if ((raw->basic_cpuid[0][EAX] < 11) || (decode_intel_extended_topology(raw, data) == 0))
		decode_number_of_cores_x86(raw, data);
	data->purpose = cpuid_identify_purpose_intel(raw);
	decode_architecture_version_x86(data);

	brand = get_brand_code_and_bits(data);
	model_code = get_model_code(data);
	for (i = 0; i < COUNT_OF(intel_bcode_str); i++) {
		if (brand.code == intel_bcode_str[i].code) {
			brand_code_str = intel_bcode_str[i].str;
			break;
		}
	}
	if (brand_code_str)
		debugf(2, "Detected Intel brand code: %d (%s)\n", brand.code, brand_code_str);
	else
		debugf(2, "Detected Intel brand code: %d\n", brand.code);
	if (brand.bits) {
		debugf(2, "Detected Intel bits: ");
		debug_print_lbits(2, brand.bits);
	}
	debugf(2, "Detected Intel model code: %d\n", model_code);

	internal->code.intel = brand.code;
	internal->bits = brand.bits;

	if (data->flags[CPU_FEATURE_SGX]) {
		debugf(2, "SGX seems to be present, decoding...\n");
		// if SGX is indicated by the CPU, verify its presence:
		decode_intel_sgx_features(raw, data);
	}

	internal->score = match_cpu_codename(cpudb_intel, COUNT_OF(cpudb_intel), data,
		brand.code, brand.bits, model_code);
	return 0;
}